

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse.c
# Opt level: O1

void dmrC_cleanup_and_cse(dmr_C *C,entrypoint *ep)

{
  allocator *alloc;
  int *piVar1;
  instruction_list *head;
  uint uVar2;
  int iVar3;
  basic_block *pbVar4;
  instruction *piVar5;
  undefined1 *puVar6;
  instruction *piVar7;
  basic_block *pbVar8;
  basic_block *pbVar9;
  instruction *piVar10;
  void *ptr;
  unsigned_long uVar11;
  undefined1 *puVar12;
  instruction_list **head_00;
  long lVar13;
  instruction_list **plist;
  instruction *insn;
  instruction *insn_00;
  ptr_list_iter local_a8;
  ptr_list_iter local_90;
  undefined1 local_78 [8];
  ptr_list_iter bbiter__;
  
  dmrC_simplify_memops(C,ep);
  alloc = &C->ptrlist_allocator;
  do {
    C->L->repeat_phase = 0;
    ptrlist_forward_iterator((ptr_list_iter *)local_78,(ptr_list *)ep->bbs);
    pbVar4 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_78);
    while (pbVar4 != (basic_block *)0x0) {
      ptrlist_forward_iterator(&local_a8,(ptr_list *)pbVar4->insns);
      piVar5 = (instruction *)ptrlist_iter_next(&local_a8);
      while (piVar5 != (instruction *)0x0) {
        if (piVar5->bb != (basic_block *)0x0) {
          if (piVar5->bb != pbVar4) {
            __assert_fail("insn->bb == bb",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/cse.c"
                          ,0x28,
                          "void clean_up_one_instruction(struct dmr_C *, struct basic_block *, struct instruction *)"
                         );
          }
          uVar2 = dmrC_simplify_instruction(C,piVar5);
          piVar1 = &C->L->repeat_phase;
          *piVar1 = *piVar1 | uVar2;
          if (piVar5->bb != (basic_block *)0x0) {
            uVar2 = *(uint *)piVar5 & 0xff;
            puVar12 = (undefined1 *)(ulong)((*(uint *)piVar5 >> 0xb) + uVar2 * 8);
            if (uVar2 - 9 < 0x1a) goto switchD_0012c2ac_caseD_30;
            switch(uVar2) {
            case 0x25:
              puVar12 = (undefined1 *)((long)&((piVar5->field_6).field_6.src3)->nr + (long)puVar12);
            case 0x30:
            case 0x31:
            case 0x33:
switchD_0012c2ac_caseD_30:
              puVar12 = &(((piVar5->field_6).field_1.bb_false)->pos).field_0x0 + (long)puVar12;
            case 0x23:
            case 0x24:
            case 0x2c:
              puVar12 = &(((piVar5->field_6).field_1.bb_true)->pos).field_0x0 + (long)puVar12;
              break;
            default:
              goto switchD_0012c2ac_caseD_26;
            case 0x2b:
              puVar12 = &(((piVar5->field_6).field_1.bb_false)->pos).field_0x0 + (long)puVar12;
              break;
            case 0x2e:
              ptrlist_forward_iterator(&local_90,(ptr_list *)(piVar5->field_6).field_1.bb_true);
              while (puVar6 = (undefined1 *)ptrlist_iter_next(&local_90),
                    puVar6 != (undefined1 *)0x0) {
                if (((pseudo *)puVar6 != &C->L->void_pseudo) &&
                   (lVar13 = *(long *)(puVar6 + 0x20), lVar13 != 0)) {
                  puVar12 = puVar12 + *(long *)(lVar13 + 8) + *(long *)(lVar13 + 0x28);
                }
              }
            }
            ptrlist_add((ptr_list **)
                        (C->L->insn_hash_table +
                        (((uint)((ulong)puVar12 >> 0x10) & 0xffff) + (int)puVar12 & 0xff)),piVar5,
                        alloc);
          }
        }
switchD_0012c2ac_caseD_26:
        piVar5 = (instruction *)ptrlist_iter_next(&local_a8);
      }
      pbVar4 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_78);
    }
    if ((C->L->repeat_phase & 3) != 0) {
      dmrC_kill_unreachable_bbs(C,ep);
    }
    lVar13 = 0;
    do {
      head = C->L->insn_hash_table[lVar13];
      if (head != (instruction_list *)0x0) {
        plist = C->L->insn_hash_table + lVar13;
        iVar3 = ptrlist_size((ptr_list *)head);
        if (1 < iVar3) {
          bbiter__._16_8_ = lVar13;
          ptrlist_sort((ptr_list **)plist,C,insn_compare);
          ptrlist_forward_iterator((ptr_list_iter *)local_78,(ptr_list *)*plist);
          piVar5 = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_78);
          lVar13 = bbiter__._16_8_;
          if (piVar5 != (instruction *)0x0) {
            insn = (instruction *)0x0;
            do {
              piVar10 = insn;
              if (((piVar5->bb != (basic_block *)0x0) &&
                  (piVar10 = piVar5, insn != (instruction *)0x0)) &&
                 (iVar3 = insn_compare(C,insn,piVar5), iVar3 == 0)) {
                pbVar4 = insn->bb;
                pbVar9 = piVar5->bb;
                if (pbVar4 == pbVar9) {
                  ptrlist_forward_iterator(&local_90,(ptr_list *)pbVar4->insns);
                  piVar7 = (instruction *)ptrlist_iter_next(&local_90);
                  while (piVar7 != (instruction *)0x0) {
                    piVar10 = insn;
                    insn_00 = piVar5;
                    if ((piVar7 == insn) || (piVar10 = piVar5, insn_00 = insn, piVar7 == piVar5)) {
                      dmrC_convert_instruction_target(C,insn_00,(piVar10->field_5).target);
                      dmrC_kill_insn(C,insn_00,0);
                      piVar1 = &C->L->repeat_phase;
                      *piVar1 = *piVar1 | 1;
                      piVar5 = piVar10;
                      break;
                    }
                    piVar7 = (instruction *)ptrlist_iter_next(&local_90);
                  }
                  piVar10 = piVar5;
                  if (piVar7 == (instruction *)0x0) {
                    dmrC_warning(C,pbVar4->pos,"Whaa? unable to find CSE instructions");
                    piVar10 = insn;
                  }
                }
                else {
                  uVar11 = C->L->bb_generation + 1;
                  C->L->bb_generation = uVar11;
                  iVar3 = bb_dominates(ep,pbVar4,pbVar9,uVar11);
                  if (iVar3 == 0) {
                    uVar11 = C->L->bb_generation + 1;
                    C->L->bb_generation = uVar11;
                    iVar3 = bb_dominates(ep,pbVar9,pbVar4,uVar11);
                    if (iVar3 == 0) {
                      iVar3 = ptrlist_size((ptr_list *)pbVar4->parents);
                      if (iVar3 == 1) {
                        pbVar8 = (basic_block *)ptrlist_first((ptr_list *)pbVar4->parents);
                        iVar3 = ptrlist_size((ptr_list *)pbVar9->parents);
                        if (iVar3 != 1) goto LAB_0012c5b0;
                        pbVar9 = (basic_block *)ptrlist_first((ptr_list *)pbVar9->parents);
                        if (pbVar9 != pbVar8) {
                          pbVar8 = (basic_block *)0x0;
                        }
                      }
                      else {
LAB_0012c5b0:
                        pbVar8 = (basic_block *)0x0;
                      }
                      piVar10 = insn;
                      if (pbVar8 != (basic_block *)0x0) {
                        dmrC_convert_instruction_target(C,piVar5,(insn->field_5).target);
                        dmrC_kill_insn(C,piVar5,0);
                        piVar1 = &C->L->repeat_phase;
                        *piVar1 = *piVar1 | 1;
                        ptrlist_remove((ptr_list **)&pbVar4->insns,insn,1);
                        head_00 = &pbVar8->insns;
                        ptr = ptrlist_undo_last((ptr_list **)head_00);
                        insn->bb = pbVar8;
                        ptrlist_add((ptr_list **)head_00,insn,alloc);
                        ptrlist_add((ptr_list **)head_00,ptr,alloc);
                      }
                    }
                    else {
                      dmrC_convert_instruction_target(C,insn,(piVar5->field_5).target);
                      dmrC_kill_insn(C,insn,0);
                      piVar1 = &C->L->repeat_phase;
                      *piVar1 = *piVar1 | 1;
                    }
                  }
                  else {
                    dmrC_convert_instruction_target(C,piVar5,(insn->field_5).target);
                    dmrC_kill_insn(C,piVar5,0);
                    piVar1 = &C->L->repeat_phase;
                    *piVar1 = *piVar1 | 1;
                    piVar10 = insn;
                  }
                }
              }
              insn = piVar10;
              piVar5 = (instruction *)ptrlist_iter_next((ptr_list_iter *)local_78);
              lVar13 = bbiter__._16_8_;
            } while (piVar5 != (instruction *)0x0);
          }
        }
        ptrlist_remove_all((ptr_list **)plist);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x100);
    if ((C->L->repeat_phase & 2) != 0) {
      dmrC_simplify_memops(C,ep);
    }
    if ((C->L->repeat_phase & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void dmrC_cleanup_and_cse(struct dmr_C *C, struct entrypoint *ep)
{
	int i;

	dmrC_simplify_memops(C, ep);
repeat:
	C->L->repeat_phase = 0;
	clean_up_insns(C, ep);
	if (C->L->repeat_phase & REPEAT_CFG_CLEANUP)
		dmrC_kill_unreachable_bbs(C, ep);
	for (i = 0; i < INSN_HASH_SIZE; i++) {
		struct instruction_list **list = C->L->insn_hash_table + i;
		if (*list) {
			if (dmrC_instruction_list_size(*list) > 1) {
				struct instruction *insn, *last;

				sort_instruction_list(C, list);

				last = NULL;
				FOR_EACH_PTR(*list, insn) {
					if (!insn->bb)
						continue;
					if (last) {
						if (!insn_compare(C, last, insn))
							insn = try_to_cse(C, ep, last, insn);
					}
					last = insn;
				} END_FOR_EACH_PTR(insn);
			}
			ptrlist_remove_all((struct ptr_list **)list);
		}
	}

	if (C->L->repeat_phase & REPEAT_SYMBOL_CLEANUP)
		dmrC_simplify_memops(C, ep);

	if (C->L->repeat_phase & REPEAT_CSE)
		goto repeat;
}